

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScenePreprocessor.cpp
# Opt level: O2

void __thiscall Assimp::ScenePreprocessor::ProcessMesh(ScenePreprocessor *this,aiMesh *mesh)

{
  float *pfVar1;
  Logger *this_00;
  aiVector3D *paVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint i;
  long lVar8;
  ulong uVar9;
  aiVector3t<float> aVar10;
  
  lVar8 = 0;
  do {
    if (lVar8 == 8) {
      if (mesh->mPrimitiveTypes == 0) {
        uVar4 = 0;
        for (lVar8 = 0; (ulong)mesh->mNumFaces << 4 != lVar8; lVar8 = lVar8 + 0x10) {
          uVar5 = *(int *)((long)&mesh->mFaces->mNumIndices + lVar8) - 1;
          uVar6 = 8;
          if (uVar5 < 3) {
            uVar6 = *(uint *)(&DAT_0062c1a0 + (ulong)uVar5 * 4);
          }
          uVar4 = uVar4 | uVar6;
          mesh->mPrimitiveTypes = uVar4;
        }
      }
      if (((mesh->mTangents != (aiVector3D *)0x0) && (mesh->mNormals != (aiVector3D *)0x0)) &&
         (mesh->mBitangents == (aiVector3D *)0x0)) {
        uVar7 = (ulong)mesh->mNumVertices;
        paVar2 = (aiVector3D *)operator_new__(uVar7 * 0xc);
        if (uVar7 != 0) {
          uVar9 = uVar7 * 0xc - 0xc;
          memset(paVar2,0,(uVar9 - uVar9 % 0xc) + 0xc);
        }
        mesh->mBitangents = paVar2;
        lVar8 = 0;
        for (uVar9 = 0; uVar9 < uVar7; uVar9 = uVar9 + 1) {
          aVar10 = operator^((aiVector3t<float> *)((long)&mesh->mNormals->x + lVar8),
                             (aiVector3t<float> *)((long)&mesh->mTangents->x + lVar8));
          paVar2 = mesh->mBitangents;
          *(long *)((long)&paVar2->x + lVar8) = aVar10._0_8_;
          *(float *)((long)&paVar2->z + lVar8) = aVar10.z;
          uVar7 = (ulong)mesh->mNumVertices;
          lVar8 = lVar8 + 0xc;
        }
      }
      return;
    }
    paVar2 = mesh->mTextureCoords[lVar8];
    if (paVar2 == (aiVector3D *)0x0) {
      uVar4 = 0;
LAB_0039efd8:
      mesh->mNumUVComponents[lVar8] = uVar4;
    }
    else {
      uVar4 = mesh->mNumUVComponents[lVar8];
      if (uVar4 == 0) {
        mesh->mNumUVComponents[lVar8] = 2;
        paVar2 = mesh->mTextureCoords[lVar8];
        lVar3 = (ulong)mesh->mNumVertices * 0xc;
LAB_0039effd:
        pfVar1 = &paVar2->x;
        for (; paVar2 != (aiVector3D *)((long)pfVar1 + lVar3); paVar2 = paVar2 + 1) {
          paVar2->z = 0.0;
        }
      }
      else {
        lVar3 = (ulong)mesh->mNumVertices * 0xc;
        if (uVar4 == 1) {
          for (; lVar3 != 0; lVar3 = lVar3 + -0xc) {
            paVar2->y = 0.0;
            paVar2->z = 0.0;
            paVar2 = paVar2 + 1;
          }
        }
        else {
          if (uVar4 == 2) goto LAB_0039effd;
          if (uVar4 == 3) {
            do {
              if (lVar3 == 0) {
                this_00 = DefaultLogger::get();
                Logger::warn(this_00,
                             "ScenePreprocessor: UVs are declared to be 3D but they\'re obviously not. Reverting to 2D."
                            );
                uVar4 = 2;
                goto LAB_0039efd8;
              }
              pfVar1 = &paVar2->z;
              paVar2 = paVar2 + 1;
              lVar3 = lVar3 + -0xc;
            } while ((*pfVar1 == 0.0) && (!NAN(*pfVar1)));
          }
        }
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void ScenePreprocessor::ProcessMesh (aiMesh* mesh)
{
    // If aiMesh::mNumUVComponents is *not* set assign the default value of 2
    for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i)   {
        if (!mesh->mTextureCoords[i]) {
            mesh->mNumUVComponents[i] = 0;
        } else {
            if (!mesh->mNumUVComponents[i])
                mesh->mNumUVComponents[i] = 2;

            aiVector3D* p = mesh->mTextureCoords[i], *end = p+mesh->mNumVertices;

            // Ensure unused components are zeroed. This will make 1D texture channels work
            // as if they were 2D channels .. just in case an application doesn't handle
            // this case
            if (2 == mesh->mNumUVComponents[i]) {
                for (; p != end; ++p)
                    p->z = 0.f;
            }
            else if (1 == mesh->mNumUVComponents[i]) {
                for (; p != end; ++p)
                    p->z = p->y = 0.f;
            }
            else if (3 == mesh->mNumUVComponents[i]) {
                // Really 3D coordinates? Check whether the third coordinate is != 0 for at least one element
                for (; p != end; ++p) {
                    if (p->z != 0)
                        break;
                }
                if (p == end) {
                    ASSIMP_LOG_WARN("ScenePreprocessor: UVs are declared to be 3D but they're obviously not. Reverting to 2D.");
                    mesh->mNumUVComponents[i] = 2;
                }
            }
        }
    }

    // If the information which primitive types are there in the
    // mesh is currently not available, compute it.
    if (!mesh->mPrimitiveTypes) {
        for (unsigned int a = 0; a < mesh->mNumFaces; ++a)  {
            aiFace& face = mesh->mFaces[a];
            switch (face.mNumIndices)
            {
            case 3u:
                mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                break;

            case 2u:
                mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                break;

            case 1u:
                mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                break;

            default:
                mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                break;
            }
        }
    }

    // If tangents and normals are given but no bitangents compute them
    if (mesh->mTangents && mesh->mNormals && !mesh->mBitangents)    {

        mesh->mBitangents = new aiVector3D[mesh->mNumVertices];
        for (unsigned int i = 0; i < mesh->mNumVertices;++i)    {
            mesh->mBitangents[i] = mesh->mNormals[i] ^ mesh->mTangents[i];
        }
    }
}